

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O3

int32_t udata_swapDataHeader_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  ulong uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < -1 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (outData == (void *)0x0 && 0 < length)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (((((uint)length < 0x18) || (*(char *)((long)inData + 2) != -0x26)) ||
             (*(char *)((long)inData + 3) != '\'')) || (*(char *)((long)inData + 10) != '\x02')) {
      uVar6 = 0;
      udata_printError_63(ds,"udata_swapDataHeader(): initial bytes do not look like ICU data\n");
      *pErrorCode = U_UNSUPPORTED_ERROR;
    }
    else {
      uVar2 = (*ds->readUInt16)(*inData);
      uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
      uVar4 = (ulong)uVar2;
      uVar6 = (uint)uVar2;
      if (((uVar3 < 0x14 || uVar2 < 0x18) || (uVar1 = (ulong)uVar3 + 4, uVar4 < uVar1)) ||
         ((uint)length < (uint)uVar2)) {
        udata_printError_63(ds,
                            "udata_swapDataHeader(): header size mismatch - headerSize %d infoSize %d length %d\n"
                            ,uVar4,(ulong)uVar3,(ulong)(uint)length);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        uVar6 = 0;
      }
      else if (0 < length) {
        if (inData != outData) {
          memcpy(outData,inData,uVar4);
        }
        *(UBool *)((long)outData + 8) = ds->outIsBigEndian;
        *(uint8_t *)((long)outData + 9) = ds->outCharset;
        (*ds->swapArray16)(ds,inData,2,outData,pErrorCode);
        (*ds->swapArray16)(ds,(void *)((long)inData + 4),4,(void *)((long)outData + 4),pErrorCode);
        uVar5 = (uint)uVar2 - (uint)uVar1;
        if (uVar5 == 0 || (uint)uVar2 < (uint)uVar1) {
          uVar5 = 0;
        }
        else {
          uVar4 = 0;
          do {
            if (*(char *)((long)((long)inData + uVar1) + uVar4) == '\0') {
              uVar5 = (uint)uVar4;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        (*ds->swapInvChars)(ds,(void *)((long)inData + uVar1),uVar5,(void *)((long)outData + uVar1),
                            pErrorCode);
      }
    }
  }
  return uVar6;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_swapDataHeader(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    uint16_t headerSize, infoSize;

    /* argument checking */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<-1 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* check minimum length and magic bytes */
    pHeader=(const DataHeader *)inData;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pHeader->info.sizeofUChar!=2
    ) {
        udata_printError(ds, "udata_swapDataHeader(): initial bytes do not look like ICU data\n");
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    headerSize=ds->readUInt16(pHeader->dataHeader.headerSize);
    infoSize=ds->readUInt16(pHeader->info.size);

    if( headerSize<sizeof(DataHeader) ||
        infoSize<sizeof(UDataInfo) ||
        headerSize<(sizeof(pHeader->dataHeader)+infoSize) ||
        (length>=0 && length<headerSize)
    ) {
        udata_printError(ds, "udata_swapDataHeader(): header size mismatch - headerSize %d infoSize %d length %d\n",
                         headerSize, infoSize, length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    if(length>0) {
        DataHeader *outHeader;
        const char *s;
        int32_t maxLength;

        /* Most of the fields are just bytes and need no swapping. */
        if(inData!=outData) {
            uprv_memcpy(outData, inData, headerSize);
        }
        outHeader=(DataHeader *)outData;

        outHeader->info.isBigEndian = ds->outIsBigEndian;
        outHeader->info.charsetFamily = ds->outCharset;

        /* swap headerSize */
        ds->swapArray16(ds, &pHeader->dataHeader.headerSize, 2, &outHeader->dataHeader.headerSize, pErrorCode);

        /* swap UDataInfo size and reservedWord */
        ds->swapArray16(ds, &pHeader->info.size, 4, &outHeader->info.size, pErrorCode);

        /* swap copyright statement after the UDataInfo */
        infoSize+=sizeof(pHeader->dataHeader);
        s=(const char *)inData+infoSize;
        maxLength=headerSize-infoSize;
        /* get the length of the string */
        for(length=0; length<maxLength && s[length]!=0; ++length) {}
        /* swap the string contents */
        ds->swapInvChars(ds, s, length, (char *)outData+infoSize, pErrorCode);
    }

    return headerSize;
}